

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O0

int coda_pcre2_substring_length_bynumber_8
              (pcre2_match_data_8 *match_data,uint32_t stringnumber,size_t *sizeptr)

{
  ulong uVar1;
  ulong uVar2;
  size_t local_48;
  uint local_3c;
  int count;
  size_t right;
  size_t left;
  size_t *sizeptr_local;
  uint32_t stringnumber_local;
  pcre2_match_data_8 *match_data_local;
  
  local_3c = match_data->rc;
  if (local_3c == 0xfffffffe) {
    if (stringnumber != 0) {
      return -2;
    }
    local_3c = 0;
  }
  else if ((int)local_3c < 0) {
    return local_3c;
  }
  if (match_data->matchedby == '\x01') {
    if (match_data->oveccount <= stringnumber) {
      return -0x36;
    }
    if ((local_3c != 0) && (local_3c <= stringnumber)) {
      return -0x37;
    }
  }
  else {
    if (match_data->code->top_bracket < stringnumber) {
      return -0x31;
    }
    if (match_data->oveccount <= stringnumber) {
      return -0x36;
    }
    if (match_data->ovector[stringnumber << 1] == 0xffffffffffffffff) {
      return -0x37;
    }
  }
  uVar1 = match_data->ovector[stringnumber << 1];
  uVar2 = match_data->ovector[stringnumber * 2 + 1];
  if ((match_data->subject_length < uVar1) || (match_data->subject_length < uVar2)) {
    match_data_local._4_4_ = -0x43;
  }
  else {
    if (sizeptr != (size_t *)0x0) {
      if (uVar2 < uVar1) {
        local_48 = 0;
      }
      else {
        local_48 = uVar2 - uVar1;
      }
      *sizeptr = local_48;
    }
    match_data_local._4_4_ = 0;
  }
  return match_data_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_length_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_SIZE *sizeptr)
{
PCRE2_SIZE left, right;
int count = match_data->rc;
if (count == PCRE2_ERROR_PARTIAL)
  {
  if (stringnumber > 0) return PCRE2_ERROR_PARTIAL;
  count = 0;
  }
else if (count < 0) return count;            /* Match failed */

if (match_data->matchedby != PCRE2_MATCHEDBY_DFA_INTERPRETER)
  {
  if (stringnumber > match_data->code->top_bracket)
    return PCRE2_ERROR_NOSUBSTRING;
  if (stringnumber >= match_data->oveccount)
    return PCRE2_ERROR_UNAVAILABLE;
  if (match_data->ovector[stringnumber*2] == PCRE2_UNSET)
    return PCRE2_ERROR_UNSET;
  }
else  /* Matched using pcre2_dfa_match() */
  {
  if (stringnumber >= match_data->oveccount) return PCRE2_ERROR_UNAVAILABLE;
  if (count != 0 && stringnumber >= (uint32_t)count) return PCRE2_ERROR_UNSET;
  }

left = match_data->ovector[stringnumber*2];
right = match_data->ovector[stringnumber*2+1];
if (left > match_data->subject_length || right > match_data->subject_length)
  return PCRE2_ERROR_INVALIDOFFSET;
if (sizeptr != NULL) *sizeptr = (left > right)? 0 : right - left;
return 0;
}